

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_ICE(project_player_handler_context_t *context)

{
  player *ppVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  long lVar5;
  player_state_conflict *ppVar6;
  undefined1 *puVar7;
  byte bVar8;
  player_state_conflict in_stack_fffffffffffffe98;
  
  bVar8 = 0;
  ppVar6 = &player->state;
  puVar7 = &stack0xfffffffffffffe98;
  for (lVar5 = 0x13c; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = (char)ppVar6->stat_add[0];
    ppVar6 = (player_state_conflict *)((long)ppVar6->stat_add + 1);
    puVar7 = puVar7 + 1;
  }
  _Var2 = player_is_immune(in_stack_fffffffffffffe98,L'\x03');
  if (!_Var2) {
    wVar3 = L'Ĭ';
    if (context->dam < L'=') {
      wVar3 = context->dam * 5;
    }
    inven_damage(player,L'\x03',wVar3);
  }
  ppVar6 = &player->state;
  puVar7 = &stack0xfffffffffffffe98;
  for (lVar5 = 0x13c; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = (char)ppVar6->stat_add[0];
    ppVar6 = (player_state_conflict *)((long)ppVar6 + (ulong)bVar8 * -2 + 1);
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  _Var2 = player_resists_effects(in_stack_fffffffffffffe98,L'\b');
  ppVar1 = player;
  if (_Var2) {
    msg("You resist the effect!");
  }
  else {
    wVar3 = damroll(5,8);
    player_inc_timed(ppVar1,L'\b',wVar3,true,true,false);
  }
  ppVar1 = player;
  uVar4 = Rand_div(0xf);
  player_inc_timed(ppVar1,L'\t',uVar4 + L'\x01',true,true,true);
  return L'\0';
}

Assistant:

static int project_player_handler_ICE(project_player_handler_context_t *context)
{
	if (!player_is_immune(player->state, ELEM_COLD))
		inven_damage(player, PROJ_COLD, MIN(context->dam * 5, 300));

	/* Cuts */
	if (!player_resists_effects(player->state, ELEM_SHARD)) {
		(void)player_inc_timed(player, TMD_CUT, damroll(5, 8), true, true,
							   false);
	} else {
		msg("You resist the effect!");
	}

	/* Stun */
	(void)player_inc_timed(player, TMD_STUN, randint1(15), true, true,
		true);
	return 0;
}